

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

void __thiscall vkt::tessellation::anon_unknown_1::Variable::~Variable(Variable *this)

{
  Variable *this_local;
  
  ~Variable(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Variable (const std::string& name_, const glu::VarType& type, const bool isArray)
		: m_name		(name_)
		, m_type		(type)
		, m_isArray		(isArray)
	{
		DE_ASSERT(!type.isArrayType());
	}